

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O1

void mbedtls_x509_crt_free(mbedtls_x509_crt *crt)

{
  mbedtls_x509_crt **ppmVar1;
  mbedtls_asn1_named_data *pmVar2;
  mbedtls_asn1_sequence *pmVar3;
  uchar *puVar4;
  size_t sVar5;
  mbedtls_asn1_named_data *pmVar6;
  mbedtls_asn1_sequence *pmVar7;
  long lVar8;
  size_t sVar9;
  mbedtls_x509_crt *cert_cur;
  mbedtls_x509_crt *pmVar10;
  mbedtls_x509_crt *__ptr;
  
  pmVar10 = crt;
  if (crt != (mbedtls_x509_crt *)0x0) {
    do {
      mbedtls_pk_free(&pmVar10->pk);
      free(pmVar10->sig_opts);
      pmVar6 = (pmVar10->issuer).next;
      while (pmVar6 != (mbedtls_asn1_named_data *)0x0) {
        pmVar2 = pmVar6->next;
        lVar8 = 0;
        do {
          *(undefined1 *)((long)&(pmVar6->oid).tag + lVar8) = 0;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x40);
        free(pmVar6);
        pmVar6 = pmVar2;
      }
      pmVar6 = (pmVar10->subject).next;
      while (pmVar6 != (mbedtls_asn1_named_data *)0x0) {
        pmVar2 = pmVar6->next;
        lVar8 = 0;
        do {
          *(undefined1 *)((long)&(pmVar6->oid).tag + lVar8) = 0;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x40);
        free(pmVar6);
        pmVar6 = pmVar2;
      }
      pmVar7 = (pmVar10->ext_key_usage).next;
      while (pmVar7 != (mbedtls_asn1_sequence *)0x0) {
        pmVar3 = pmVar7->next;
        lVar8 = 0;
        do {
          *(undefined1 *)((long)&(pmVar7->buf).tag + lVar8) = 0;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x20);
        free(pmVar7);
        pmVar7 = pmVar3;
      }
      pmVar7 = (pmVar10->subject_alt_names).next;
      while (pmVar7 != (mbedtls_asn1_sequence *)0x0) {
        pmVar3 = pmVar7->next;
        lVar8 = 0;
        do {
          *(undefined1 *)((long)&(pmVar7->buf).tag + lVar8) = 0;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 0x20);
        free(pmVar7);
        pmVar7 = pmVar3;
      }
      puVar4 = (pmVar10->raw).p;
      if (puVar4 != (uchar *)0x0) {
        sVar5 = (pmVar10->raw).len;
        if (sVar5 != 0) {
          sVar9 = 0;
          do {
            puVar4[sVar9] = '\0';
            sVar9 = sVar9 + 1;
          } while (sVar5 != sVar9);
        }
        free((pmVar10->raw).p);
      }
      ppmVar1 = &pmVar10->next;
      __ptr = crt;
      pmVar10 = *ppmVar1;
    } while (*ppmVar1 != (mbedtls_x509_crt *)0x0);
    do {
      pmVar10 = __ptr->next;
      lVar8 = 0;
      do {
        *(undefined1 *)((long)&(__ptr->raw).tag + lVar8) = 0;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x228);
      if (__ptr != crt) {
        free(__ptr);
      }
      __ptr = pmVar10;
    } while (pmVar10 != (mbedtls_x509_crt *)0x0);
  }
  return;
}

Assistant:

void mbedtls_x509_crt_free( mbedtls_x509_crt *crt )
{
    mbedtls_x509_crt *cert_cur = crt;
    mbedtls_x509_crt *cert_prv;
    mbedtls_x509_name *name_cur;
    mbedtls_x509_name *name_prv;
    mbedtls_x509_sequence *seq_cur;
    mbedtls_x509_sequence *seq_prv;

    if( crt == NULL )
        return;

    do
    {
        mbedtls_pk_free( &cert_cur->pk );

#if defined(MBEDTLS_X509_RSASSA_PSS_SUPPORT)
        mbedtls_free( cert_cur->sig_opts );
#endif

        name_cur = cert_cur->issuer.next;
        while( name_cur != NULL )
        {
            name_prv = name_cur;
            name_cur = name_cur->next;
            mbedtls_zeroize( name_prv, sizeof( mbedtls_x509_name ) );
            mbedtls_free( name_prv );
        }

        name_cur = cert_cur->subject.next;
        while( name_cur != NULL )
        {
            name_prv = name_cur;
            name_cur = name_cur->next;
            mbedtls_zeroize( name_prv, sizeof( mbedtls_x509_name ) );
            mbedtls_free( name_prv );
        }

        seq_cur = cert_cur->ext_key_usage.next;
        while( seq_cur != NULL )
        {
            seq_prv = seq_cur;
            seq_cur = seq_cur->next;
            mbedtls_zeroize( seq_prv, sizeof( mbedtls_x509_sequence ) );
            mbedtls_free( seq_prv );
        }

        seq_cur = cert_cur->subject_alt_names.next;
        while( seq_cur != NULL )
        {
            seq_prv = seq_cur;
            seq_cur = seq_cur->next;
            mbedtls_zeroize( seq_prv, sizeof( mbedtls_x509_sequence ) );
            mbedtls_free( seq_prv );
        }

        if( cert_cur->raw.p != NULL )
        {
            mbedtls_zeroize( cert_cur->raw.p, cert_cur->raw.len );
            mbedtls_free( cert_cur->raw.p );
        }

        cert_cur = cert_cur->next;
    }
    while( cert_cur != NULL );

    cert_cur = crt;
    do
    {
        cert_prv = cert_cur;
        cert_cur = cert_cur->next;

        mbedtls_zeroize( cert_prv, sizeof( mbedtls_x509_crt ) );
        if( cert_prv != crt )
            mbedtls_free( cert_prv );
    }
    while( cert_cur != NULL );
}